

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int net_socket_read_wait(NETSOCKET sock,int time)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  fd_set *__arr;
  uint __i;
  int sockid;
  timeval tv;
  fd_set readfds;
  uint local_c8;
  int local_c4;
  int local_bc;
  timeval local_b8 [2];
  int iStack_90;
  int local_8c;
  fd_set local_88;
  long local_8;
  
  iStack_90 = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8[0].tv_sec = 0;
  local_b8[0].tv_usec = (__suseconds_t)(in_EDX * 1000);
  local_c4 = 0;
  for (local_c8 = 0; local_c8 < 0x10; local_c8 = local_c8 + 1) {
    local_88.fds_bits[local_c8] = 0;
  }
  if (-1 < in_RDI) {
    local_88.fds_bits[iStack_90 / 0x40] =
         1L << ((byte)((long)iStack_90 % 0x40) & 0x3f) | local_88.fds_bits[iStack_90 / 0x40];
    local_c4 = iStack_90;
  }
  if ((-1 < in_ESI) &&
     (local_88.fds_bits[in_ESI / 0x40] =
           1L << ((byte)((long)in_ESI % 0x40) & 0x3f) | local_88.fds_bits[in_ESI / 0x40],
     local_c4 < in_ESI)) {
    local_c4 = in_ESI;
  }
  local_8c = in_ESI;
  select(local_c4 + 1,&local_88,(fd_set *)0x0,(fd_set *)0x0,local_b8);
  if ((iStack_90 < 0) ||
     ((local_88.fds_bits[iStack_90 / 0x40] & 1L << ((byte)((long)iStack_90 % 0x40) & 0x3f)) == 0)) {
    if ((local_8c < 0) ||
       ((local_88.fds_bits[local_8c / 0x40] & 1L << ((byte)((long)local_8c % 0x40) & 0x3f)) == 0)) {
      local_bc = 0;
    }
    else {
      local_bc = 1;
    }
  }
  else {
    local_bc = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_bc;
}

Assistant:

int net_socket_read_wait(NETSOCKET sock, int time)
{
	struct timeval tv;
	fd_set readfds;
	int sockid;

	tv.tv_sec = 0;
	tv.tv_usec = 1000*time;
	sockid = 0;

	FD_ZERO(&readfds);
	if(sock.ipv4sock >= 0)
	{
		FD_SET(sock.ipv4sock, &readfds);
		sockid = sock.ipv4sock;
	}
	if(sock.ipv6sock >= 0)
	{
		FD_SET(sock.ipv6sock, &readfds);
		if(sock.ipv6sock > sockid)
			sockid = sock.ipv6sock;
	}

	/* don't care about writefds and exceptfds */
	select(sockid+1, &readfds, NULL, NULL, &tv);

	if(sock.ipv4sock >= 0 && FD_ISSET(sock.ipv4sock, &readfds))
		return 1;

	if(sock.ipv6sock >= 0 && FD_ISSET(sock.ipv6sock, &readfds))
		return 1;

	return 0;
}